

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O2

void __thiscall QFileDialogComboBox::showPopup(QFileDialogComboBox *this)

{
  long lVar1;
  QFileSystemModel *pQVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  undefined4 uVar6;
  uint uVar7;
  QAbstractItemModel *pQVar8;
  QAbstractItemModel *pQVar9;
  QStandardItemModel *pQVar10;
  undefined8 uVar11;
  int i;
  ulong uVar12;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QUrl url;
  QArrayDataPointer<QUrl> local_b8;
  QUrlPrivate *local_98;
  undefined1 *puStack_90;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_88;
  QArrayDataPointer<QUrl> local_78;
  QUrl path;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar8 = QComboBox::model(&this->super_QComboBox);
  path.d = (QUrlPrivate *)0xffffffffffffffff;
  iVar5 = (**(code **)(*(long *)pQVar8 + 0x78))(pQVar8);
  if (1 < iVar5) {
    QComboBox::showPopup(&this->super_QComboBox);
  }
  path.d = (QUrlPrivate *)0x0;
  QUrlModel::setUrls(this->urlModel,(QList<QUrl> *)&path);
  QArrayDataPointer<QUrl>::~QArrayDataPointer((QArrayDataPointer<QUrl> *)&path);
  local_78.size = 0;
  local_78.d = (Data *)0x0;
  local_78.ptr = (QUrl *)0x0;
  local_88.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_98 = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar2 = this->d_ptr->model;
  QFileDialogPrivate::rootPath((QString *)&path,this->d_ptr);
  QFileSystemModel::index((QString *)&local_98,(int)pQVar2);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&path);
  while (((-1 < (int)local_98 && (-1 < (long)local_98)) &&
         (local_88.ptr != (QAbstractItemModel *)0x0))) {
    url.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    QModelIndex::data((QVariant *)&path,(QModelIndex *)&local_98,0x101);
    ::QVariant::toString();
    QUrl::fromLocalFile((QString *)&url);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b8);
    ::QVariant::~QVariant((QVariant *)&path);
    cVar3 = QUrl::isValid();
    if (cVar3 != '\0') {
      QList<QUrl>::emplaceBack<QUrl_const&>((QList<QUrl> *)&local_78,&url);
    }
    QModelIndex::parent((QModelIndex *)&path,(QModelIndex *)&local_98);
    local_88.ptr = (QAbstractItemModel *)0x0;
    local_98 = path.d;
    puStack_90 = (undefined1 *)0x0;
    QUrl::~QUrl(&url);
  }
  latin1.m_data = "file:";
  latin1.m_size = 5;
  QString::QString((QString *)&path,latin1);
  QUrl::QUrl((QUrl *)&local_b8,(QString *)&path,TolerantMode);
  QList<QUrl>::emplaceBack<QUrl>((QList<QUrl> *)&local_78,(QUrl *)&local_b8);
  QUrl::~QUrl((QUrl *)&local_b8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&path);
  QUrlModel::addUrls(this->urlModel,(QList<QUrl> *)&local_78,0,true);
  pQVar8 = QComboBox::model(&this->super_QComboBox);
  pQVar9 = QComboBox::model(&this->super_QComboBox);
  local_b8.d = (Data *)0xffffffffffffffff;
  local_b8.ptr = (QUrl *)0x0;
  local_b8.size = 0;
  iVar5 = (**(code **)(*(long *)pQVar9 + 0x78))(pQVar9,&local_b8);
  url.d = (QUrlPrivate *)0xffffffffffffffff;
  (**(code **)(*(long *)pQVar8 + 0x60))(&path,pQVar8,iVar5 + -1,0);
  local_88.ptr = (QAbstractItemModel *)0x0;
  local_98 = path.d;
  puStack_90 = (undefined1 *)0x0;
  local_b8.d = (Data *)0x0;
  local_b8.ptr = (QUrl *)0x0;
  local_b8.size = 0;
  for (uVar12 = 0; uVar12 < (ulong)(this->m_history).d.size; uVar12 = uVar12 + 1) {
    path.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    QUrl::fromLocalFile((QString *)&path);
    bVar4 = QListSpecialMethodsBase<QUrl>::contains<QUrl>
                      ((QListSpecialMethodsBase<QUrl> *)&local_b8,&path);
    if (!bVar4) {
      QList<QUrl>::emplaceFront<QUrl_const&>((QList<QUrl> *)&local_b8,&path);
    }
    QUrl::~QUrl(&path);
  }
  if (local_b8.size != 0) {
    pQVar8 = QComboBox::model(&this->super_QComboBox);
    pQVar9 = QComboBox::model(&this->super_QComboBox);
    path.d = (QUrlPrivate *)0xffffffffffffffff;
    uVar6 = (**(code **)(*(long *)pQVar9 + 0x78))(pQVar9);
    url.d = (QUrlPrivate *)0xffffffffffffffff;
    (**(code **)(*(long *)pQVar8 + 0xf8))(pQVar8,uVar6,1,&url);
    pQVar8 = QComboBox::model(&this->super_QComboBox);
    pQVar9 = QComboBox::model(&this->super_QComboBox);
    url.d = (QUrlPrivate *)0xffffffffffffffff;
    iVar5 = (**(code **)(*(long *)pQVar9 + 0x78))(pQVar9,&url);
    (**(code **)(*(long *)pQVar8 + 0x60))(&path,pQVar8,iVar5 + -1,0);
    local_88.ptr = (QAbstractItemModel *)0x0;
    local_98 = path.d;
    puStack_90 = (undefined1 *)0x0;
    pQVar8 = QComboBox::model(&this->super_QComboBox);
    QFileDialog::tr((QString *)&url,"Recent Places",(char *)0x0,-1);
    ::QVariant::QVariant((QVariant *)&path,(QString *)&url);
    (**(code **)(*(long *)pQVar8 + 0x98))(pQVar8,&local_98,(QVariant *)&path);
    ::QVariant::~QVariant((QVariant *)&path);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&url);
    pQVar8 = QComboBox::model(&this->super_QComboBox);
    pQVar10 = QtPrivate::qobject_cast_helper<QStandardItemModel*,QObject>((QObject *)pQVar8);
    if (pQVar10 != (QStandardItemModel *)0x0) {
      uVar7 = (**(code **)(*(long *)pQVar10 + 0x138))(pQVar10,&local_98);
      uVar11 = QStandardItemModel::item((int)pQVar10,(int)local_98);
      QStandardItem::setFlags(uVar11,uVar7 & 0xffffffdf);
    }
    QUrlModel::addUrls(this->urlModel,(QList<QUrl> *)&local_b8,-1,false);
  }
  QComboBox::setCurrentIndex(&this->super_QComboBox,0);
  QComboBox::showPopup(&this->super_QComboBox);
  QArrayDataPointer<QUrl>::~QArrayDataPointer(&local_b8);
  QArrayDataPointer<QUrl>::~QArrayDataPointer(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogComboBox::showPopup()
{
    if (model()->rowCount() > 1)
        QComboBox::showPopup();

    urlModel->setUrls(QList<QUrl>());
    QList<QUrl> list;
    QModelIndex idx = d_ptr->model->index(d_ptr->rootPath());
    while (idx.isValid()) {
        QUrl url = QUrl::fromLocalFile(idx.data(QFileSystemModel::FilePathRole).toString());
        if (url.isValid())
            list.append(url);
        idx = idx.parent();
    }
    // add "my computer"
    list.append(QUrl("file:"_L1));
    urlModel->addUrls(list, 0);
    idx = model()->index(model()->rowCount() - 1, 0);

    // append history
    QList<QUrl> urls;
    for (int i = 0; i < m_history.size(); ++i) {
        QUrl path = QUrl::fromLocalFile(m_history.at(i));
        if (!urls.contains(path))
            urls.prepend(path);
    }
    if (urls.size() > 0) {
        model()->insertRow(model()->rowCount());
        idx = model()->index(model()->rowCount()-1, 0);
        // ### TODO maybe add a horizontal line before this
        model()->setData(idx, QFileDialog::tr("Recent Places"));
        QStandardItemModel *m = qobject_cast<QStandardItemModel*>(model());
        if (m) {
            Qt::ItemFlags flags = m->flags(idx);
            flags &= ~Qt::ItemIsEnabled;
            m->item(idx.row(), idx.column())->setFlags(flags);
        }
        urlModel->addUrls(urls, -1, false);
    }
    setCurrentIndex(0);

    QComboBox::showPopup();
}